

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QueryFuncs.cpp
# Opt level: O0

void slang::ast::builtins::registerQueryFuncs(Compilation *c)

{
  Compilation *pCVar1;
  unique_ptr<slang::ast::builtins::ArrayDimensionFunction,_std::default_delete<slang::ast::builtins::ArrayDimensionFunction>_>
  local_d8;
  unique_ptr<slang::ast::SystemSubroutine,_std::default_delete<slang::ast::SystemSubroutine>_>
  local_d0;
  undefined1 local_c1;
  unique_ptr<slang::ast::builtins::ArrayDimensionFunction,_std::default_delete<slang::ast::builtins::ArrayDimensionFunction>_>
  local_c0;
  unique_ptr<slang::ast::SystemSubroutine,_std::default_delete<slang::ast::SystemSubroutine>_>
  local_b8;
  unique_ptr<slang::ast::builtins::IncrementFunction,_std::default_delete<slang::ast::builtins::IncrementFunction>_>
  local_b0;
  unique_ptr<slang::ast::SystemSubroutine,_std::default_delete<slang::ast::SystemSubroutine>_>
  local_a8;
  unique_ptr<slang::ast::builtins::SizeFunction,_std::default_delete<slang::ast::builtins::SizeFunction>_>
  local_a0;
  unique_ptr<slang::ast::SystemSubroutine,_std::default_delete<slang::ast::SystemSubroutine>_>
  local_98;
  unique_ptr<slang::ast::builtins::RightFunction,_std::default_delete<slang::ast::builtins::RightFunction>_>
  local_90;
  unique_ptr<slang::ast::SystemSubroutine,_std::default_delete<slang::ast::SystemSubroutine>_>
  local_88;
  unique_ptr<slang::ast::builtins::LeftFunction,_std::default_delete<slang::ast::builtins::LeftFunction>_>
  local_80;
  unique_ptr<slang::ast::SystemSubroutine,_std::default_delete<slang::ast::SystemSubroutine>_>
  local_78;
  unique_ptr<slang::ast::builtins::HighFunction,_std::default_delete<slang::ast::builtins::HighFunction>_>
  local_70;
  unique_ptr<slang::ast::SystemSubroutine,_std::default_delete<slang::ast::SystemSubroutine>_>
  local_68;
  unique_ptr<slang::ast::builtins::LowFunction,_std::default_delete<slang::ast::builtins::LowFunction>_>
  local_60;
  unique_ptr<slang::ast::SystemSubroutine,_std::default_delete<slang::ast::SystemSubroutine>_>
  local_58;
  unique_ptr<slang::ast::builtins::IsUnboundedFunction,_std::default_delete<slang::ast::builtins::IsUnboundedFunction>_>
  local_50;
  unique_ptr<slang::ast::SystemSubroutine,_std::default_delete<slang::ast::SystemSubroutine>_>
  local_48;
  unique_ptr<slang::ast::builtins::TypenameFunction,_std::default_delete<slang::ast::builtins::TypenameFunction>_>
  local_40;
  unique_ptr<slang::ast::SystemSubroutine,_std::default_delete<slang::ast::SystemSubroutine>_>
  local_38 [3];
  unique_ptr<slang::ast::builtins::BitsFunction,_std::default_delete<slang::ast::builtins::BitsFunction>_>
  local_20;
  unique_ptr<slang::ast::SystemSubroutine,_std::default_delete<slang::ast::SystemSubroutine>_>
  local_18;
  Compilation *local_10;
  Compilation *c_local;
  
  local_10 = c;
  std::make_unique<slang::ast::builtins::BitsFunction>();
  std::unique_ptr<slang::ast::SystemSubroutine,std::default_delete<slang::ast::SystemSubroutine>>::
  unique_ptr<slang::ast::builtins::BitsFunction,std::default_delete<slang::ast::builtins::BitsFunction>,void>
            ((unique_ptr<slang::ast::SystemSubroutine,std::default_delete<slang::ast::SystemSubroutine>>
              *)&local_18,&local_20);
  Compilation::addSystemSubroutine(c,&local_18);
  std::unique_ptr<slang::ast::SystemSubroutine,_std::default_delete<slang::ast::SystemSubroutine>_>
  ::~unique_ptr(&local_18);
  std::
  unique_ptr<slang::ast::builtins::BitsFunction,_std::default_delete<slang::ast::builtins::BitsFunction>_>
  ::~unique_ptr(&local_20);
  pCVar1 = local_10;
  std::make_unique<slang::ast::builtins::TypenameFunction>();
  std::unique_ptr<slang::ast::SystemSubroutine,std::default_delete<slang::ast::SystemSubroutine>>::
  unique_ptr<slang::ast::builtins::TypenameFunction,std::default_delete<slang::ast::builtins::TypenameFunction>,void>
            ((unique_ptr<slang::ast::SystemSubroutine,std::default_delete<slang::ast::SystemSubroutine>>
              *)local_38,&local_40);
  Compilation::addSystemSubroutine(pCVar1,local_38);
  std::unique_ptr<slang::ast::SystemSubroutine,_std::default_delete<slang::ast::SystemSubroutine>_>
  ::~unique_ptr(local_38);
  std::
  unique_ptr<slang::ast::builtins::TypenameFunction,_std::default_delete<slang::ast::builtins::TypenameFunction>_>
  ::~unique_ptr(&local_40);
  pCVar1 = local_10;
  std::make_unique<slang::ast::builtins::IsUnboundedFunction>();
  std::unique_ptr<slang::ast::SystemSubroutine,std::default_delete<slang::ast::SystemSubroutine>>::
  unique_ptr<slang::ast::builtins::IsUnboundedFunction,std::default_delete<slang::ast::builtins::IsUnboundedFunction>,void>
            ((unique_ptr<slang::ast::SystemSubroutine,std::default_delete<slang::ast::SystemSubroutine>>
              *)&local_48,&local_50);
  Compilation::addSystemSubroutine(pCVar1,&local_48);
  std::unique_ptr<slang::ast::SystemSubroutine,_std::default_delete<slang::ast::SystemSubroutine>_>
  ::~unique_ptr(&local_48);
  std::
  unique_ptr<slang::ast::builtins::IsUnboundedFunction,_std::default_delete<slang::ast::builtins::IsUnboundedFunction>_>
  ::~unique_ptr(&local_50);
  pCVar1 = local_10;
  std::make_unique<slang::ast::builtins::LowFunction>();
  std::unique_ptr<slang::ast::SystemSubroutine,std::default_delete<slang::ast::SystemSubroutine>>::
  unique_ptr<slang::ast::builtins::LowFunction,std::default_delete<slang::ast::builtins::LowFunction>,void>
            ((unique_ptr<slang::ast::SystemSubroutine,std::default_delete<slang::ast::SystemSubroutine>>
              *)&local_58,&local_60);
  Compilation::addSystemSubroutine(pCVar1,&local_58);
  std::unique_ptr<slang::ast::SystemSubroutine,_std::default_delete<slang::ast::SystemSubroutine>_>
  ::~unique_ptr(&local_58);
  std::
  unique_ptr<slang::ast::builtins::LowFunction,_std::default_delete<slang::ast::builtins::LowFunction>_>
  ::~unique_ptr(&local_60);
  pCVar1 = local_10;
  std::make_unique<slang::ast::builtins::HighFunction>();
  std::unique_ptr<slang::ast::SystemSubroutine,std::default_delete<slang::ast::SystemSubroutine>>::
  unique_ptr<slang::ast::builtins::HighFunction,std::default_delete<slang::ast::builtins::HighFunction>,void>
            ((unique_ptr<slang::ast::SystemSubroutine,std::default_delete<slang::ast::SystemSubroutine>>
              *)&local_68,&local_70);
  Compilation::addSystemSubroutine(pCVar1,&local_68);
  std::unique_ptr<slang::ast::SystemSubroutine,_std::default_delete<slang::ast::SystemSubroutine>_>
  ::~unique_ptr(&local_68);
  std::
  unique_ptr<slang::ast::builtins::HighFunction,_std::default_delete<slang::ast::builtins::HighFunction>_>
  ::~unique_ptr(&local_70);
  pCVar1 = local_10;
  std::make_unique<slang::ast::builtins::LeftFunction>();
  std::unique_ptr<slang::ast::SystemSubroutine,std::default_delete<slang::ast::SystemSubroutine>>::
  unique_ptr<slang::ast::builtins::LeftFunction,std::default_delete<slang::ast::builtins::LeftFunction>,void>
            ((unique_ptr<slang::ast::SystemSubroutine,std::default_delete<slang::ast::SystemSubroutine>>
              *)&local_78,&local_80);
  Compilation::addSystemSubroutine(pCVar1,&local_78);
  std::unique_ptr<slang::ast::SystemSubroutine,_std::default_delete<slang::ast::SystemSubroutine>_>
  ::~unique_ptr(&local_78);
  std::
  unique_ptr<slang::ast::builtins::LeftFunction,_std::default_delete<slang::ast::builtins::LeftFunction>_>
  ::~unique_ptr(&local_80);
  pCVar1 = local_10;
  std::make_unique<slang::ast::builtins::RightFunction>();
  std::unique_ptr<slang::ast::SystemSubroutine,std::default_delete<slang::ast::SystemSubroutine>>::
  unique_ptr<slang::ast::builtins::RightFunction,std::default_delete<slang::ast::builtins::RightFunction>,void>
            ((unique_ptr<slang::ast::SystemSubroutine,std::default_delete<slang::ast::SystemSubroutine>>
              *)&local_88,&local_90);
  Compilation::addSystemSubroutine(pCVar1,&local_88);
  std::unique_ptr<slang::ast::SystemSubroutine,_std::default_delete<slang::ast::SystemSubroutine>_>
  ::~unique_ptr(&local_88);
  std::
  unique_ptr<slang::ast::builtins::RightFunction,_std::default_delete<slang::ast::builtins::RightFunction>_>
  ::~unique_ptr(&local_90);
  pCVar1 = local_10;
  std::make_unique<slang::ast::builtins::SizeFunction>();
  std::unique_ptr<slang::ast::SystemSubroutine,std::default_delete<slang::ast::SystemSubroutine>>::
  unique_ptr<slang::ast::builtins::SizeFunction,std::default_delete<slang::ast::builtins::SizeFunction>,void>
            ((unique_ptr<slang::ast::SystemSubroutine,std::default_delete<slang::ast::SystemSubroutine>>
              *)&local_98,&local_a0);
  Compilation::addSystemSubroutine(pCVar1,&local_98);
  std::unique_ptr<slang::ast::SystemSubroutine,_std::default_delete<slang::ast::SystemSubroutine>_>
  ::~unique_ptr(&local_98);
  std::
  unique_ptr<slang::ast::builtins::SizeFunction,_std::default_delete<slang::ast::builtins::SizeFunction>_>
  ::~unique_ptr(&local_a0);
  pCVar1 = local_10;
  std::make_unique<slang::ast::builtins::IncrementFunction>();
  std::unique_ptr<slang::ast::SystemSubroutine,std::default_delete<slang::ast::SystemSubroutine>>::
  unique_ptr<slang::ast::builtins::IncrementFunction,std::default_delete<slang::ast::builtins::IncrementFunction>,void>
            ((unique_ptr<slang::ast::SystemSubroutine,std::default_delete<slang::ast::SystemSubroutine>>
              *)&local_a8,&local_b0);
  Compilation::addSystemSubroutine(pCVar1,&local_a8);
  std::unique_ptr<slang::ast::SystemSubroutine,_std::default_delete<slang::ast::SystemSubroutine>_>
  ::~unique_ptr(&local_a8);
  std::
  unique_ptr<slang::ast::builtins::IncrementFunction,_std::default_delete<slang::ast::builtins::IncrementFunction>_>
  ::~unique_ptr(&local_b0);
  pCVar1 = local_10;
  local_c1 = 0;
  std::make_unique<slang::ast::builtins::ArrayDimensionFunction,char_const(&)[12],bool>
            ((char (*) [12])&local_c0,(bool *)"$dimensions");
  std::unique_ptr<slang::ast::SystemSubroutine,std::default_delete<slang::ast::SystemSubroutine>>::
  unique_ptr<slang::ast::builtins::ArrayDimensionFunction,std::default_delete<slang::ast::builtins::ArrayDimensionFunction>,void>
            ((unique_ptr<slang::ast::SystemSubroutine,std::default_delete<slang::ast::SystemSubroutine>>
              *)&local_b8,&local_c0);
  Compilation::addSystemSubroutine(pCVar1,&local_b8);
  std::unique_ptr<slang::ast::SystemSubroutine,_std::default_delete<slang::ast::SystemSubroutine>_>
  ::~unique_ptr(&local_b8);
  std::
  unique_ptr<slang::ast::builtins::ArrayDimensionFunction,_std::default_delete<slang::ast::builtins::ArrayDimensionFunction>_>
  ::~unique_ptr(&local_c0);
  pCVar1 = local_10;
  std::make_unique<slang::ast::builtins::ArrayDimensionFunction,char_const(&)[21],bool>
            ((char (*) [21])&local_d8,(bool *)"$unpacked_dimensions");
  std::unique_ptr<slang::ast::SystemSubroutine,std::default_delete<slang::ast::SystemSubroutine>>::
  unique_ptr<slang::ast::builtins::ArrayDimensionFunction,std::default_delete<slang::ast::builtins::ArrayDimensionFunction>,void>
            ((unique_ptr<slang::ast::SystemSubroutine,std::default_delete<slang::ast::SystemSubroutine>>
              *)&local_d0,&local_d8);
  Compilation::addSystemSubroutine(pCVar1,&local_d0);
  std::unique_ptr<slang::ast::SystemSubroutine,_std::default_delete<slang::ast::SystemSubroutine>_>
  ::~unique_ptr(&local_d0);
  std::
  unique_ptr<slang::ast::builtins::ArrayDimensionFunction,_std::default_delete<slang::ast::builtins::ArrayDimensionFunction>_>
  ::~unique_ptr(&local_d8);
  return;
}

Assistant:

void registerQueryFuncs(Compilation& c) {
#define REGISTER(name) c.addSystemSubroutine(std::make_unique<name##Function>())
    REGISTER(Bits);
    REGISTER(Typename);
    REGISTER(IsUnbounded);
    REGISTER(Low);
    REGISTER(High);
    REGISTER(Left);
    REGISTER(Right);
    REGISTER(Size);
    REGISTER(Increment);
#undef REGISTER

    c.addSystemSubroutine(std::make_unique<ArrayDimensionFunction>("$dimensions", false));
    c.addSystemSubroutine(std::make_unique<ArrayDimensionFunction>("$unpacked_dimensions", true));
}